

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O0

ggml_status ggml_backend_sched_graph_compute(ggml_backend_sched_t sched,ggml_cgraph *graph)

{
  ggml_status gVar1;
  ggml_backend_sched_t in_RSI;
  ggml_status err;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  gVar1 = ggml_backend_sched_graph_compute_async
                    ((ggml_backend_sched_t)
                     CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                     (ggml_cgraph *)0x16219d);
  ggml_backend_sched_synchronize(in_RSI);
  return gVar1;
}

Assistant:

enum ggml_status ggml_backend_sched_graph_compute(ggml_backend_sched_t sched, struct ggml_cgraph * graph) {
    enum ggml_status err = ggml_backend_sched_graph_compute_async(sched, graph);
    ggml_backend_sched_synchronize(sched);
    return err;
}